

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeInternalJacobians
          (ChElementHexaANCF_3813_9 *this,double Kfactor,double Rfactor)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  ActualDstType actualDst;
  ChMatrixNM<double,_33,_33> result;
  Brick9_Jacobian formula;
  Matrix<double,_33,_33,_1,_33,_33> local_6658;
  ChIntegrable3D<Eigen::Matrix<double,_33,_33,_1,_33,_33>_> local_4450;
  ChElementHexaANCF_3813_9 *local_4448;
  double local_4440;
  double local_4438;
  
  memset(&this->m_JacobianMatrix,0,0x2208);
  this->m_InteCounter = 0;
  local_4450._vptr_ChIntegrable3D = (_func_int **)&PTR__ChIntegrable3D_00b5dcc8;
  local_4448 = this;
  local_4440 = Kfactor;
  local_4438 = Rfactor;
  memset(&local_6658,0,0x2208);
  ChQuadrature::Integrate3D<Eigen::Matrix<double,33,33,1,33,33>>
            (&local_6658,&local_4450,-1.0,1.0,-1.0,1.0,-1.0,1.0,2);
  uVar5 = 0xfffffffffffffffe;
  do {
    dVar3 = local_6658.super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>.m_storage.
            m_data.array[uVar5 + 3];
    pdVar1 = (this->m_JacobianMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>.m_storage.m_data.array
             + uVar5 + 2;
    dVar4 = pdVar1[1];
    pdVar2 = (this->m_JacobianMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>.m_storage.m_data.array
             + uVar5 + 2;
    *pdVar2 = local_6658.super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>.m_storage.
              m_data.array[uVar5 + 2] + *pdVar1;
    pdVar2[1] = dVar3 + dVar4;
    uVar5 = uVar5 + 2;
  } while (uVar5 < 0x43e);
  (this->m_JacobianMatrix).super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>.
  m_storage.m_data.array[0x440] =
       local_6658.super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>.m_storage.m_data.
       array[0x440] +
       (this->m_JacobianMatrix).super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>.
       m_storage.m_data.array[0x440];
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeInternalJacobians(double Kfactor, double Rfactor) {
    m_JacobianMatrix.setZero();
    m_InteCounter = 0;
    Brick9_Jacobian formula(this, Kfactor, Rfactor);
    ChMatrixNM<double, 33, 33> result;
    result.setZero();
    ChQuadrature::Integrate3D<ChMatrixNM<double, 33, 33>>(result,   // result of integration
                                                          formula,  // integrand formula
                                                          -1, 1,    // x limits
                                                          -1, 1,    // y limits
                                                          -1, 1,    // z limits
                                                          2         // order of integration
    );
    // Accumulate Jacobian
    m_JacobianMatrix += result;
}